

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_validate(JSON_Value *schema,JSON_Value *value)

{
  int iVar1;
  int iVar2;
  JSON_Array *pJVar3;
  ulong uVar4;
  JSON_Status JVar5;
  JSON_Value *pJVar6;
  JSON_Value *value_00;
  JSON_Object *object;
  unsigned_long *puVar7;
  char *name;
  JSON_Object *pJVar8;
  ulong uVar9;
  
  if (value != (JSON_Value *)0x0 && schema != (JSON_Value *)0x0) {
    iVar1 = schema->type;
    iVar2 = value->type;
    if (iVar1 == 1 || iVar1 == iVar2) {
      JVar5 = 0;
      switch(iVar1) {
      case 1:
      case 2:
      case 3:
      case 6:
        goto switchD_0019fe9f_caseD_1;
      case 4:
        pJVar8 = (schema->value).object;
        if (iVar2 == 4) {
          object = (value->value).object;
        }
        else {
          object = (JSON_Object *)0x0;
        }
        if (pJVar8 == (JSON_Object *)0x0) {
          return 0;
        }
        uVar4 = pJVar8->count;
        if (uVar4 == 0) {
          return 0;
        }
        if (object == (JSON_Object *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = object->count;
        }
        if (uVar4 <= uVar9) {
          uVar9 = 0;
          do {
            if (uVar4 == uVar9) {
              return 0;
            }
            if (uVar9 < pJVar8->count) {
              name = pJVar8->names[uVar9];
            }
            else {
              name = (char *)0x0;
            }
            pJVar6 = json_object_get_value(pJVar8,name);
            value_00 = json_object_get_value(object,name);
            if (value_00 == (JSON_Value *)0x0) break;
            JVar5 = json_validate(pJVar6,value_00);
            uVar9 = uVar9 + 1;
          } while (JVar5 == 0);
        }
        break;
      case 5:
        pJVar3 = (schema->value).array;
        if (iVar2 == 5) {
          pJVar8 = (value->value).object;
        }
        else {
          pJVar8 = (JSON_Object *)0x0;
        }
        if (pJVar3 == (JSON_Array *)0x0) {
          return 0;
        }
        if (pJVar3->count == 0) {
          return 0;
        }
        if (pJVar8 == (JSON_Object *)0x0) {
          return 0;
        }
        pJVar6 = *pJVar3->items;
        puVar7 = (unsigned_long *)0x0;
        do {
          if (pJVar8->hashes <= puVar7) {
            return 0;
          }
          JVar5 = json_validate(pJVar6,(JSON_Value *)pJVar8->cells[(long)puVar7]);
          puVar7 = (unsigned_long *)((long)puVar7 + 1);
        } while (JVar5 == 0);
      }
    }
  }
  JVar5 = -1;
switchD_0019fe9f_caseD_1:
  return JVar5;
}

Assistant:

JSON_Status json_validate(const JSON_Value *schema, const JSON_Value *value) {
    JSON_Value *temp_schema_value = NULL, *temp_value = NULL;
    JSON_Array *schema_array = NULL, *value_array = NULL;
    JSON_Object *schema_object = NULL, *value_object = NULL;
    JSON_Value_Type schema_type = JSONError, value_type = JSONError;
    const char *key = NULL;
    size_t i = 0, count = 0;
    if (schema == NULL || value == NULL) {
        return JSONFailure;
    }
    schema_type = json_value_get_type(schema);
    value_type = json_value_get_type(value);
    if (schema_type != value_type && schema_type != JSONNull) { /* null represents all values */
        return JSONFailure;
    }
    switch (schema_type) {
        case JSONArray:
            schema_array = json_value_get_array(schema);
            value_array = json_value_get_array(value);
            count = json_array_get_count(schema_array);
            if (count == 0) {
                return JSONSuccess; /* Empty array allows all types */
            }
            /* Get first value from array, rest is ignored */
            temp_schema_value = json_array_get_value(schema_array, 0);
            for (i = 0; i < json_array_get_count(value_array); i++) {
                temp_value = json_array_get_value(value_array, i);
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONObject:
            schema_object = json_value_get_object(schema);
            value_object = json_value_get_object(value);
            count = json_object_get_count(schema_object);
            if (count == 0) {
                return JSONSuccess; /* Empty object allows all objects */
            } else if (json_object_get_count(value_object) < count) {
                return JSONFailure; /* Tested object mustn't have less name-value pairs than schema */
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(schema_object, i);
                temp_schema_value = json_object_get_value(schema_object, key);
                temp_value = json_object_get_value(value_object, key);
                if (temp_value == NULL) {
                    return JSONFailure;
                }
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONString: case JSONNumber: case JSONBoolean: case JSONNull:
            return JSONSuccess; /* equality already tested before switch */
        case JSONError: default:
            return JSONFailure;
    }
}